

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_CallAsmInternalCommon
          (InterpreterStackFrame *this,ScriptFunction *function,RegSlot returnReg)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  Which WVar4;
  int iVar5;
  FunctionBody *this_00;
  ThreadContext *this_01;
  long lVar6;
  undefined4 *puVar7;
  float fVar8;
  double dVar9;
  AsmJsRetType local_5c;
  ArgSlot nVarToPop;
  _func_void_ptr_RecyclableObject_ptr_CallInfo____ *p_Stack_58;
  JavascriptMethod jsMethod;
  FunctionEntryPointInfo *entrypointInfo;
  ScriptContext *scriptContext;
  byte *reg;
  AsmJsFunctionInfo *pAStack_30;
  uint alignedArgsSize;
  AsmJsFunctionInfo *asmInfo;
  AsmJsScriptFunction *scriptFunc;
  ScriptFunction *pSStack_18;
  RegSlot returnReg_local;
  ScriptFunction *function_local;
  InterpreterStackFrame *this_local;
  
  scriptFunc._4_4_ = returnReg;
  pSStack_18 = function;
  function_local = (ScriptFunction *)this;
  asmInfo = (AsmJsFunctionInfo *)VarTo<Js::AsmJsScriptFunction,Js::ScriptFunction>(function);
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)asmInfo);
  pAStack_30 = FunctionBody::GetAsmJsFunctionInfo(this_00);
  AVar3 = AsmJsFunctionInfo::GetArgByteSize(pAStack_30);
  reg._4_4_ = ::Math::Align<unsigned_int>((uint)AVar3,0x10);
  scriptContext = (ScriptContext *)0x0;
  entrypointInfo =
       (FunctionEntryPointInfo *)RecyclableObject::GetScriptContext((RecyclableObject *)pSStack_18);
  jsMethod = (JavascriptMethod)ScriptFunction::GetEntryPointInfo(pSStack_18);
  this_01 = ScriptContext::GetThreadContext((ScriptContext *)entrypointInfo);
  ThreadContext::ProbeStack
            (this_01,(ulong)(reg._4_4_ + 0xc00),(RecyclableObject *)pSStack_18,
             (ScriptContext *)entrypointInfo);
  p_Stack_58 = *(_func_void_ptr_RecyclableObject_ptr_CallInfo____ **)(jsMethod + 0x10);
  local_5c = AsmJsFunctionInfo::GetReturnType(pAStack_30);
  WVar4 = AsmJsRetType::which(&local_5c);
  switch(WVar4) {
  case Int64:
    lVar6 = JavascriptFunction::CallAsmJsFunction<long>
                      ((RecyclableObject *)pSStack_18,p_Stack_58,*(void ***)(this + 0x28),reg._4_4_,
                       (uchar *)scriptContext);
    *(long *)(*(long *)(this + 0x120) + (ulong)scriptFunc._4_4_ * 8) = lVar6;
    break;
  case Double:
    dVar9 = JavascriptFunction::CallAsmJsFunction<double>
                      ((RecyclableObject *)pSStack_18,p_Stack_58,*(void ***)(this + 0x28),reg._4_4_,
                       (uchar *)scriptContext);
    *(double *)(*(long *)(this + 0x128) + (ulong)scriptFunc._4_4_ * 8) = dVar9;
    break;
  case Float:
    fVar8 = JavascriptFunction::CallAsmJsFunction<float>
                      ((RecyclableObject *)pSStack_18,p_Stack_58,*(void ***)(this + 0x28),reg._4_4_,
                       (uchar *)scriptContext);
    *(float *)(*(long *)(this + 0x130) + (ulong)scriptFunc._4_4_ * 4) = fVar8;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0xf34,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    break;
  case Signed:
    iVar5 = JavascriptFunction::CallAsmJsFunction<int>
                      ((RecyclableObject *)pSStack_18,p_Stack_58,*(void ***)(this + 0x28),reg._4_4_,
                       (uchar *)scriptContext);
    *(int *)(*(long *)(this + 0x118) + (ulong)scriptFunc._4_4_ * 4) = iVar5;
    break;
  case Void:
    JavascriptFunction::CallAsmJsFunction<int>
              ((RecyclableObject *)pSStack_18,p_Stack_58,*(void ***)(this + 0x28),reg._4_4_,
               (uchar *)scriptContext);
    break;
  case Int32x4:
  case Uint32x4:
  case Int16x8:
  case Int8x16:
  case Uint16x8:
  case Uint8x16:
  case Bool32x4:
  case Bool16x8:
  case Bool8x16:
  case Float32x4:
  case Float64x2:
  }
  AVar3 = AsmJsFunctionInfo::GetArgByteSize(pAStack_30);
  PopOut(this,(AVar3 >> 3) + 1);
  if (pSStack_18 == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0xf3a,"(function)","function");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_CallAsmInternalCommon(ScriptFunction* function, RegSlot returnReg)
    {
        AsmJsScriptFunction* scriptFunc = VarTo<AsmJsScriptFunction>(function);
        AsmJsFunctionInfo* asmInfo = scriptFunc->GetFunctionBody()->GetAsmJsFunctionInfo();
        uint alignedArgsSize = ::Math::Align<uint32>(asmInfo->GetArgByteSize(), 16);
#if _M_X64 && _WIN32
        // convention is to always allocate spill space for rcx,rdx,r8,r9
        if (alignedArgsSize < 0x20) alignedArgsSize = 0x20;
        uint* argSizes = asmInfo->GetArgsSizesArray();
        Assert(asmInfo->GetArgSizeArrayLength() >= 2);
        byte* curOutParams = (byte*)m_outParams + sizeof(Var);
        Assert(curOutParams + argSizes[0] + argSizes[1] + 16 <= (byte*)this->m_outParamsEnd);

        // Prepare in advance the possible arguments that will need to be put in register
        byte _declspec(align(16)) reg[3 * 16];
        CompileAssert((FunctionBody::MinAsmJsOutParams() * sizeof(Var)) == (sizeof(Var) * 2 + sizeof(reg)));
        js_memcpy_s(reg, 16, curOutParams, 16);
        js_memcpy_s(reg + 16, 16, curOutParams + argSizes[0], 16);
        js_memcpy_s(reg + 32, 16, curOutParams + argSizes[0] + argSizes[1], 16);
#else
        byte* reg = nullptr;
#endif

        ScriptContext * scriptContext = function->GetScriptContext();
        Js::FunctionEntryPointInfo* entrypointInfo = (Js::FunctionEntryPointInfo*)function->GetEntryPointInfo();
        PROBE_STACK_CALL(scriptContext, function, alignedArgsSize + Js::Constants::MinStackDefault);
        // Calling the jsMethod might change the entrypoint, adding the variable here 
        // will save the method on the stack helping debug what really got called
        JavascriptMethod jsMethod = entrypointInfo->jsMethod;

        switch (asmInfo->GetReturnType().which())
        {
        case AsmJsRetType::Void:
            JavascriptFunction::CallAsmJsFunction<int>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Signed:

            m_localIntSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<int>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Int64:
            m_localInt64Slots[returnReg] = JavascriptFunction::CallAsmJsFunction<int64>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Double:
            m_localDoubleSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<double>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Float:
            m_localFloatSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<float>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
#ifdef ENABLE_WASM_SIMD
        case AsmJsRetType::Float32x4:
        case AsmJsRetType::Int32x4:
        case AsmJsRetType::Bool32x4:
        case AsmJsRetType::Bool16x8:
        case AsmJsRetType::Bool8x16:
        case AsmJsRetType::Float64x2:
        case AsmJsRetType::Int16x8:
        case AsmJsRetType::Int8x16:
        case AsmJsRetType::Uint32x4:
        case AsmJsRetType::Uint16x8:
        case AsmJsRetType::Uint8x16:
#if _WIN32 //WASM.SIMD ToDo: Enable thunk for Xplat
#if _M_X64
#if !defined(__clang__)
            X86SIMDValue simdVal;
            simdVal.m128_value = JavascriptFunction::CallAsmJsFunction<__m128>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            m_localSimdSlots[returnReg] = X86SIMDValue::ToSIMDValue(simdVal);
#else
            AssertOrFailFastMsg(false, "This particular path causes linking issues in clang on windows; potential difference in name mangling?");
#endif // !defined(__clang__)
#else
            m_localSimdSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<AsmJsSIMDValue>(function, jsMethod, m_outParams, alignedArgsSize, reg);
#endif // _M_X64
#endif // _WIN32
            break;
#endif // ENABLE_WASM_SIMD
        default:
            Assume(UNREACHED);
        }

        const ArgSlot nVarToPop = (asmInfo->GetArgByteSize() / sizeof(Var)) + 1;
        PopOut(nVarToPop);

        Assert(function);
    }